

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptConstructor(HlslGrammar *this,TIntermTyped **node)

{
  HlslToken *loc;
  bool bVar1;
  TFunction *function;
  TIntermTyped *pTVar2;
  TIntermTyped *arguments;
  TType type;
  
  TType::TType(&type,EbtVoid,EvqTemporary,1,0,0,false);
  bVar1 = acceptType(this,&type);
  if (bVar1) {
    loc = &(this->super_HlslTokenStream).token;
    function = HlslParseContext::makeConstructorCall(this->parseContext,&loc->loc,&type);
    if (function != (TFunction *)0x0) {
      arguments = (TIntermTyped *)0x0;
      bVar1 = acceptArguments(this,function,&arguments);
      if (bVar1) {
        if (arguments != (TIntermTyped *)0x0) {
          pTVar2 = HlslParseContext::handleFunctionCall
                             (this->parseContext,&loc->loc,function,arguments);
          *node = pTVar2;
          return pTVar2 != (TIntermTyped *)0x0;
        }
        expected(this,"one or more arguments");
      }
      else {
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      }
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptConstructor(TIntermTyped*& node)
{
    // type
    TType type;
    if (acceptType(type)) {
        TFunction* constructorFunction = parseContext.makeConstructorCall(token.loc, type);
        if (constructorFunction == nullptr)
            return false;

        // arguments
        TIntermTyped* arguments = nullptr;
        if (! acceptArguments(constructorFunction, arguments)) {
            // It's possible this is a type keyword used as an identifier.  Put the token back
            // for later use.
            recedeToken();
            return false;
        }

        if (arguments == nullptr) {
            expected("one or more arguments");
            return false;
        }

        // hook it up
        node = parseContext.handleFunctionCall(token.loc, constructorFunction, arguments);

        return node != nullptr;
    }

    return false;
}